

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.hh
# Opt level: O0

VarnodeData * __thiscall AddrSpace::getSpacebaseFull(AddrSpace *this,int4 i)

{
  LowlevelError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [36];
  int4 local_14;
  AddrSpace *pAStack_10;
  int4 i_local;
  AddrSpace *this_local;
  
  local_14 = i;
  pAStack_10 = this;
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::operator+(local_38,(char *)&this->name);
  LowlevelError::LowlevelError(this_00,local_38);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

inline const VarnodeData &AddrSpace::getSpacebaseFull(int4 i) const {
  throw LowlevelError(name+" has no truncated registers");
}